

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_dd8::ByteSwap<float>::Run(ByteSwap<float> *this,istream *input_stream)

{
  int iVar1;
  ulong uVar2;
  float *in_RSI;
  long in_RDI;
  uchar *p;
  int offset;
  int address;
  float data;
  int c;
  int i;
  uchar tmp;
  int skip_size;
  int data_size;
  ostream *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  float *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar3;
  int local_48;
  int local_44;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  
  local_44 = *(int *)(in_RDI + 8) + *(int *)(in_RDI + 0xc) * 4;
  if (in_RSI == (float *)&std::cin) {
    local_28 = 0;
    while( true ) {
      bVar3 = false;
      if (local_28 < local_44) {
        bVar3 = sptk::ReadStream<unsigned_char>
                          ((uchar *)in_stack_ffffffffffffff98,
                           (istream *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
        ;
      }
      if (bVar3 == false) break;
      local_28 = local_28 + 1;
    }
    in_stack_ffffffffffffffa7 = 0;
    in_RSI = in_stack_ffffffffffffff98;
  }
  else {
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (streamoff)in_stack_ffffffffffffff88);
    std::istream::seekg(in_RSI,local_38,local_30);
  }
  iVar1 = std::istream::peek();
  if ((iVar1 != -1) && (uVar2 = std::ios::fail(), (uVar2 & 1) == 0)) {
    local_48 = *(int *)(in_RDI + 0xc);
    while( true ) {
      if (((*(int *)(in_RDI + 0x10) == -1) ||
          (in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff,
          local_44 <= *(int *)(in_RDI + 0x10))) &&
         ((*(int *)(in_RDI + 0x14) == -1 ||
          (in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff,
          local_48 <= *(int *)(in_RDI + 0x14))))) {
        bVar3 = sptk::ReadStream<float>
                          (in_RSI,(istream *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffff94 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff94);
      }
      if ((char)(in_stack_ffffffffffffff94 >> 0x18) == '\0') break;
      std::reverse<unsigned_char*>
                ((uchar *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 (uchar *)in_RSI);
      bVar3 = sptk::WriteStream<float>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (!bVar3) {
        return false;
      }
      local_44 = local_44 + 4;
      local_48 = local_48 + 1;
    }
    return true;
  }
  return false;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    // Skip data.
    const int data_size(static_cast<int>(sizeof(T)));
    const int skip_size(start_address_ + data_size * start_offset_);
    if (&std::cin == input_stream) {
      unsigned char tmp;
      int i(0);
      while (i < skip_size && sptk::ReadStream(&tmp, input_stream)) {
        ++i;
      }
    } else {
      input_stream->seekg(skip_size);
    }
    const int c(input_stream->peek());
    if (EOF == c || input_stream->fail()) {
      return false;
    }

    // Swap data.
    T data;
    for (int address(skip_size), offset(start_offset_);
         (kMagicNumberForEnd == end_address_ || address <= end_address_) &&
         (kMagicNumberForEnd == end_offset_ || offset <= end_offset_) &&
         sptk::ReadStream(&data, input_stream);
         address += data_size, ++offset) {
      unsigned char* p(reinterpret_cast<unsigned char*>(&data));
      std::reverse(p, p + data_size);
      if (!sptk::WriteStream(data, &std::cout)) {
        return false;
      }
    }

    return true;
  }